

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

TabletPointData * QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)

{
  long lVar1;
  qsizetype qVar2;
  long in_RDI;
  long in_FS_OFFSET;
  TabletPointData *pointData;
  int i;
  rvalue_ref in_stack_ffffffffffffffa8;
  TabletPointData *in_stack_ffffffffffffffb0;
  int local_34;
  reference local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_34 = 0;
      qVar2 = QList<QGuiApplicationPrivate::TabletPointData>::size(&tabletDevicePoints),
      local_34 < qVar2; local_34 = local_34 + 1) {
    local_28 = QList<QGuiApplicationPrivate::TabletPointData>::operator[]
                         ((QList<QGuiApplicationPrivate::TabletPointData> *)
                          in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
    if (local_28->deviceId == in_RDI) goto LAB_0036c286;
  }
  TabletPointData::TabletPointData(in_stack_ffffffffffffffb0,(qint64)in_stack_ffffffffffffffa8);
  QList<QGuiApplicationPrivate::TabletPointData>::append
            ((QList<QGuiApplicationPrivate::TabletPointData> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  local_28 = QList<QGuiApplicationPrivate::TabletPointData>::last
                       ((QList<QGuiApplicationPrivate::TabletPointData> *)in_stack_ffffffffffffffa8)
  ;
LAB_0036c286:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QGuiApplicationPrivate::TabletPointData &QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)
{
    for (int i = 0; i < tabletDevicePoints.size(); ++i) {
        TabletPointData &pointData = tabletDevicePoints[i];
        if (pointData.deviceId == deviceId)
            return pointData;
    }

    tabletDevicePoints.append(TabletPointData(deviceId));
    return tabletDevicePoints.last();
}